

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O2

uint64_t __thiscall r_exec::_Mem::start(_Mem *this)

{
  pointer ppGVar1;
  pointer ppGVar2;
  Group *this_00;
  _Hash_node_base *p_Var3;
  View *pVVar4;
  pointer ppVar5;
  bool bVar6;
  uint32_t uVar7;
  ulong now;
  ModelBase *pMVar8;
  TimeJob *pTVar9;
  uint64_t uVar10;
  UpdateJob *this_01;
  PerfSamplingJob *this_02;
  pair<r_exec::View_*,_r_exec::Group_*> *initial_reduction_job;
  pointer ppVar11;
  __node_base *p_Var12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  uint8_t selector_1;
  const_iterator end;
  const_iterator v;
  uint8_t selector;
  float local_64;
  float local_60;
  float local_5c;
  vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
  initial_reduction_jobs;
  
  if ((this->state & ~STOPPED) == NOT_STARTED) {
    LOCK();
    (this->m_coreCount).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    initial_reduction_jobs.
    super__Vector_base<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    initial_reduction_jobs.
    super__Vector_base<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    initial_reduction_jobs.
    super__Vector_base<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    now = (*Now)();
    r_code::Utils::SetTimeReference(now);
    pMVar8 = ModelBase::Get();
    pMVar8->thz = this->secondary_thz;
    init_timings(this,now);
    uVar13 = 0;
    while( true ) {
      ppGVar1 = (this->initial_groups).
                super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppGVar2 = (this->initial_groups).
                super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)ppGVar2 - (long)ppGVar1 >> 3) <= uVar13) break;
      this_00 = ppGVar1[uVar13];
      fVar14 = Group::get_c_act(this_00);
      local_5c = Group::get_c_act_thr(this_00);
      local_60 = Group::get_c_sln(this_00);
      local_64 = Group::get_c_sln_thr(this_00);
      v.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
               (this_00->ipgm_views)._M_h._M_before_begin._M_nxt;
      end.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
               (__node_type *)0x0;
      _selector = _selector & 0xffffffffffffff00;
      while (bVar6 = Group::all_views_cond(this_00,&selector,&v,&end), bVar6) {
        r_code::Utils::SetIndirectTimestamp<r_exec::View>
                  (*(View **)((long)v.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                    ._M_cur + 0x10),2,now);
        v.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
        _M_cur = *(_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                   *)v.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                     ._M_cur;
      }
      if (local_5c < fVar14) {
        p_Var12 = &(this_00->input_less_ipgm_views)._M_h._M_before_begin;
        while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
          p_Var3 = (*(_Hash_node_base **)
                     &((_Prime_rehash_policy *)(p_Var12 + 2))->_M_max_load_factor)[0x16]._M_nxt;
          if ((p_Var3 != (_Hash_node_base *)0x0) && (p_Var3[3]._M_nxt == (_Hash_node_base *)0x1)) {
            pTVar9 = (TimeJob *)operator_new(0x28);
            pVVar4 = *(View **)&((_Prime_rehash_policy *)(p_Var12 + 2))->_M_max_load_factor;
            uVar10 = r_code::Utils::GetTimestamp<r_code::Code>
                               ((Code *)(pVVar4->super_View).object.object,4);
            InputLessPGMSignalingJob::InputLessPGMSignalingJob
                      ((InputLessPGMSignalingJob *)pTVar9,pVVar4,uVar10 + now);
            pushTimeJob(this,pTVar9);
          }
        }
        p_Var12 = &(this_00->anti_ipgm_views)._M_h._M_before_begin;
        while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
          p_Var3 = (*(_Hash_node_base **)
                     &((_Prime_rehash_policy *)(p_Var12 + 2))->_M_max_load_factor)[0x16]._M_nxt;
          if ((p_Var3 != (_Hash_node_base *)0x0) && (p_Var3[3]._M_nxt == (_Hash_node_base *)0x1)) {
            pTVar9 = (TimeJob *)operator_new(0x28);
            pVVar4 = *(View **)&((_Prime_rehash_policy *)(p_Var12 + 2))->_M_max_load_factor;
            uVar10 = r_code::Utils::GetTimestamp<r_code::Code>
                               ((Code *)(pVVar4->super_View).object.object,4);
            AntiPGMSignalingJob::AntiPGMSignalingJob
                      ((AntiPGMSignalingJob *)pTVar9,pVVar4,uVar10 + now);
            pushTimeJob(this,pTVar9);
          }
        }
      }
      if (local_64 < local_60) {
        end.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                   )(this_00->ipgm_views)._M_h._M_before_begin._M_nxt;
        _selector = (__node_type *)0x0;
        selector_1 = '\0';
        while (bVar6 = Group::all_views_cond(this_00,&selector_1,&end,(const_iterator *)&selector),
              bVar6) {
          fVar14 = View::get_sln(*(View **)((long)end.
                                                  super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ._M_cur + 0x10));
          fVar15 = Group::get_sln_thr(this_00);
          if (fVar15 < fVar14) {
            std::
            _Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
            ::_M_insert_equal<core::P<r_exec::View>const&>
                      ((_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                        *)&this_00->newly_salient_views,
                       (P<r_exec::View> *)
                       ((long)end.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                              ._M_cur + 0x10));
            v.
            super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
            ._M_cur = *(_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                        *)((long)end.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                 ._M_cur + 0x10);
            std::
            vector<std::pair<r_exec::View*,r_exec::Group*>,std::allocator<std::pair<r_exec::View*,r_exec::Group*>>>
            ::emplace_back<std::pair<r_exec::View*,r_exec::Group*>>
                      ((vector<std::pair<r_exec::View*,r_exec::Group*>,std::allocator<std::pair<r_exec::View*,r_exec::Group*>>>
                        *)&initial_reduction_jobs,(pair<r_exec::View_*,_r_exec::Group_*> *)&v);
          }
          end.
          super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
          _M_cur = *(_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                     *)end.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                       ._M_cur;
        }
      }
      uVar7 = Group::get_upr(this_00);
      if (uVar7 != 0) {
        this_01 = (UpdateJob *)operator_new(0x28);
        uVar10 = Group::get_next_upr_time(this_00,now);
        UpdateJob::UpdateJob(this_01,this_00,uVar10);
        pushTimeJob(this,(TimeJob *)this_01);
      }
      uVar13 = uVar13 + 1;
    }
    if (ppGVar2 != ppGVar1) {
      (this->initial_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppGVar1;
    }
    this->state = RUNNING;
    this_02 = (PerfSamplingJob *)operator_new(0x28);
    PerfSamplingJob::PerfSamplingJob
              (this_02,now + this->perf_sampling_period,this->perf_sampling_period);
    pushTimeJob(this,(TimeJob *)this_02);
    for (uVar13 = 0; uVar13 < this->reduction_core_count; uVar13 = uVar13 + 1) {
      end.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
               runReductionCore;
      std::thread::thread<void(*)(),,void>((thread *)&v,(_func_void **)&end);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&this->m_coreThreads,(thread *)&v);
      std::thread::~thread((thread *)&v);
    }
    for (uVar13 = 0;
        ppVar5 = initial_reduction_jobs.
                 super__Vector_base<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        ppVar11 = initial_reduction_jobs.
                  super__Vector_base<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, uVar13 < this->time_core_count;
        uVar13 = uVar13 + 1) {
      end.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
               runTimeCore;
      std::thread::thread<void(*)(),,void>((thread *)&v,(_func_void **)&end);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&this->m_coreThreads,(thread *)&v);
      std::thread::~thread((thread *)&v);
    }
    for (; ppVar11 != ppVar5; ppVar11 = ppVar11 + 1) {
      Group::inject_reduction_jobs(ppVar11->second,ppVar11->first);
    }
    std::
    _Vector_base<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
    ::~_Vector_base(&initial_reduction_jobs.
                     super__Vector_base<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
                   );
  }
  else {
    now = 0;
  }
  return now;
}

Assistant:

uint64_t _Mem::start()
{
    if (state != STOPPED && state != NOT_STARTED) {
        return 0;
    }

    m_coreCount = 0;
    std::vector<std::pair<View *, Group *> > initial_reduction_jobs;
    uint64_t i;
    uint64_t now = Now();
    Utils::SetTimeReference(now);
    ModelBase::Get()->set_thz(secondary_thz);
    init_timings(now);

    for (i = 0; i < initial_groups.size(); ++i) {
        Group *g = initial_groups[i];
        bool c_active = g->get_c_act() > g->get_c_act_thr();
        bool c_salient = g->get_c_sln() > g->get_c_sln_thr();
        FOR_ALL_VIEWS_BEGIN(g, v)
        Utils::SetIndirectTimestamp<View>(v->second, VIEW_IJT, now); // init injection time for the view.
        FOR_ALL_VIEWS_END

        if (c_active) {
            std::unordered_map<uint64_t, P<View> >::const_iterator v;

            // build signaling jobs for active input-less overlays.
            for (v = g->input_less_ipgm_views.begin(); v != g->input_less_ipgm_views.end(); ++v) {
                if (v->second->controller != nullptr && v->second->controller->is_activated()) {
                    pushTimeJob(new InputLessPGMSignalingJob(v->second, now + Utils::GetTimestamp<Code>(v->second->object, IPGM_TSC)));
                }
            }

            // build signaling jobs for active anti-pgm overlays.
            for (v = g->anti_ipgm_views.begin(); v != g->anti_ipgm_views.end(); ++v) {
                if (v->second->controller != nullptr && v->second->controller->is_activated()) {
                    pushTimeJob(new AntiPGMSignalingJob(v->second, now + Utils::GetTimestamp<Code>(v->second->object, IPGM_TSC)));
                }
            }
        }

        if (c_salient) {
            // build reduction jobs for each salient view and each active overlay - regardless of the view's sync mode.
            FOR_ALL_VIEWS_BEGIN(g, v)

            if (v->second->get_sln() > g->get_sln_thr()) { // salient view.
                g->newly_salient_views.insert(v->second);
                initial_reduction_jobs.push_back(std::pair<View *, Group *>(v->second, g));
            }

            FOR_ALL_VIEWS_END
        }

        if (g->get_upr() > 0) { // inject the next update job for the group.
            pushTimeJob(new UpdateJob(g, g->get_next_upr_time(now)));
        }
    }

    initial_groups.clear();
    state = RUNNING;
    pushTimeJob(new PerfSamplingJob(now + perf_sampling_period, perf_sampling_period));

    for (i = 0; i < reduction_core_count; ++i) {
        m_coreThreads.push_back(std::thread(&r_exec::runReductionCore));
    }

    for (i = 0; i < time_core_count; ++i) {
        m_coreThreads.push_back(std::thread(&r_exec::runTimeCore));
    }

    for (auto & initial_reduction_job : initial_reduction_jobs) {
        initial_reduction_job.second->inject_reduction_jobs(initial_reduction_job.first);
    }

    return now;
}